

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fMultisampleTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::anon_unknown_0::DefaultFBOMultisampleCase::init
          (DefaultFBOMultisampleCase *this,EVP_PKEY_CTX *ctx)

{
  code *pcVar1;
  char *pcVar2;
  bool bVar3;
  ContextType ctxType;
  int iVar4;
  deUint32 dVar5;
  int iVar6;
  int y;
  int extraout_EAX;
  RenderContext *pRVar7;
  mapped_type *this_00;
  undefined4 extraout_var;
  RenderTarget *pRVar8;
  NotSupportedError *this_01;
  MessageBuilder *pMVar9;
  ShaderProgram *pSVar10;
  ProgramSources *pPVar11;
  TestError *pTVar12;
  char *local_448;
  allocator<char> local_429;
  string local_428;
  StringTemplate local_408;
  string local_3e8;
  ShaderSource local_3c8;
  allocator<char> local_399;
  string local_398;
  StringTemplate local_378;
  string local_358;
  ShaderSource local_338;
  ProgramSources local_310;
  MessageBuilder local_240;
  undefined1 local_ba;
  allocator<char> local_b9;
  string local_b8;
  long local_98;
  Functions *gl;
  TestLog *log;
  key_type local_80;
  undefined1 local_50 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  args;
  bool supportsES32;
  DefaultFBOMultisampleCase *this_local;
  
  pRVar7 = Context::getRenderContext((this->super_TestCase).m_context);
  ctxType.super_ApiType.m_bits = (ApiType)(*pRVar7->_vptr_RenderContext[2])();
  args._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = glu::ApiType::es(3,2);
  bVar3 = glu::contextSupports(ctxType,args._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)local_50);
  if (bVar3) {
    local_448 = glu::getGLSLVersionDeclaration(GLSL_VERSION_320_ES);
  }
  else {
    local_448 = glu::getGLSLVersionDeclaration(GLSL_VERSION_310_ES);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"GLSL_VERSION_DECL",(allocator<char> *)((long)&log + 7));
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_50,&local_80);
  std::__cxx11::string::operator=((string *)this_00,local_448);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator((allocator<char> *)((long)&log + 7));
  gl = (Functions *)
       tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  pRVar7 = Context::getRenderContext((this->super_TestCase).m_context);
  iVar4 = (*pRVar7->_vptr_RenderContext[3])();
  local_98 = CONCAT44(extraout_var,iVar4);
  pRVar8 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar4 = tcu::RenderTarget::getNumSamples(pRVar8);
  if (iVar4 < 2) {
    local_ba = 1;
    this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,"No multisample buffers",&local_b9);
    tcu::NotSupportedError::NotSupportedError(this_01,&local_b8);
    local_ba = 0;
    __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  this->m_initCalled = true;
  (**(code **)(local_98 + 0x868))(0x80a9,&this->m_numSamples);
  dVar5 = (**(code **)(local_98 + 0x800))();
  glu::checkError(dVar5,"getIntegerv(GL_SAMPLES)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleTests.cpp"
                  ,0x108);
  tcu::TestLog::operator<<(&local_240,(TestLog *)gl,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar9 = tcu::MessageBuilder::operator<<(&local_240,(char (*) [14])"GL_SAMPLES = ");
  pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&this->m_numSamples);
  tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_240);
  pSVar10 = (ShaderProgram *)operator_new(0xd0);
  pRVar7 = Context::getRenderContext((this->super_TestCase).m_context);
  glu::ProgramSources::ProgramSources(&local_310);
  pcVar2 = init::vertShaderSource;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_398,pcVar2,&local_399);
  tcu::StringTemplate::StringTemplate(&local_378,&local_398);
  tcu::StringTemplate::specialize
            (&local_358,&local_378,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_50);
  glu::VertexSource::VertexSource((VertexSource *)&local_338,&local_358);
  pPVar11 = glu::ProgramSources::operator<<(&local_310,&local_338);
  pcVar2 = init::fragShaderSource;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_428,pcVar2,&local_429);
  tcu::StringTemplate::StringTemplate(&local_408,&local_428);
  tcu::StringTemplate::specialize
            (&local_3e8,&local_408,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_50);
  glu::FragmentSource::FragmentSource((FragmentSource *)&local_3c8,&local_3e8);
  pPVar11 = glu::ProgramSources::operator<<(pPVar11,&local_3c8);
  glu::ShaderProgram::ShaderProgram(pSVar10,pRVar7,pPVar11);
  this->m_program = pSVar10;
  glu::FragmentSource::~FragmentSource((FragmentSource *)&local_3c8);
  std::__cxx11::string::~string((string *)&local_3e8);
  tcu::StringTemplate::~StringTemplate(&local_408);
  std::__cxx11::string::~string((string *)&local_428);
  std::allocator<char>::~allocator(&local_429);
  glu::VertexSource::~VertexSource((VertexSource *)&local_338);
  std::__cxx11::string::~string((string *)&local_358);
  tcu::StringTemplate::~StringTemplate(&local_378);
  std::__cxx11::string::~string((string *)&local_398);
  std::allocator<char>::~allocator(&local_399);
  glu::ProgramSources::~ProgramSources(&local_310);
  bVar3 = glu::ShaderProgram::isOk(this->m_program);
  if (!bVar3) {
    pTVar12 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar12,"Failed to compile program",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleTests.cpp"
               ,0x113);
    __cxa_throw(pTVar12,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  pcVar1 = *(code **)(local_98 + 0x780);
  dVar5 = glu::ShaderProgram::getProgram(this->m_program);
  iVar4 = (*pcVar1)(dVar5,"a_position");
  this->m_attrPositionLoc = iVar4;
  pcVar1 = *(code **)(local_98 + 0x780);
  dVar5 = glu::ShaderProgram::getProgram(this->m_program);
  iVar4 = (*pcVar1)(dVar5,"a_color");
  this->m_attrColorLoc = iVar4;
  dVar5 = (**(code **)(local_98 + 0x800))();
  glu::checkError(dVar5,"getAttribLocation",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleTests.cpp"
                  ,0x117);
  if ((-1 < this->m_attrPositionLoc) && (-1 < this->m_attrColorLoc)) {
    iVar4 = this->m_desiredViewportSize;
    pRVar8 = Context::getRenderTarget((this->super_TestCase).m_context);
    iVar6 = tcu::RenderTarget::getWidth(pRVar8);
    pRVar8 = Context::getRenderTarget((this->super_TestCase).m_context);
    y = tcu::RenderTarget::getHeight(pRVar8);
    iVar6 = de::min<int>(iVar6,y);
    iVar4 = de::min<int>(iVar4,iVar6);
    this->m_viewportSize = iVar4;
    randomizeViewport(this);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)local_50);
    return extraout_EAX;
  }
  pSVar10 = this->m_program;
  if (pSVar10 != (ShaderProgram *)0x0) {
    glu::ShaderProgram::~ShaderProgram(pSVar10);
    operator_delete(pSVar10,0xd0);
  }
  pTVar12 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar12,"Invalid attribute locations",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleTests.cpp"
             ,0x11c);
  __cxa_throw(pTVar12,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

void DefaultFBOMultisampleCase::init (void)
{
	const bool					supportsES32 = glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2));
	map<string, string>			args;
	args["GLSL_VERSION_DECL"] = supportsES32 ? getGLSLVersionDeclaration(glu::GLSL_VERSION_320_ES) : getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES);

	static const char* vertShaderSource =
		"${GLSL_VERSION_DECL}\n"
		"in highp vec4 a_position;\n"
		"in mediump vec4 a_color;\n"
		"out mediump vec4 v_color;\n"
		"void main()\n"
		"{\n"
		"	gl_Position = a_position;\n"
		"	v_color = a_color;\n"
		"}\n";

	static const char* fragShaderSource =
		"${GLSL_VERSION_DECL}\n"
		"in mediump vec4 v_color;\n"
		"layout(location = 0) out mediump vec4 o_color;\n"
		"void main()\n"
		"{\n"
		"	o_color = v_color;\n"
		"}\n";

	TestLog&				log	= m_testCtx.getLog();
	const glw::Functions&	gl	= m_context.getRenderContext().getFunctions();

	if (m_context.getRenderTarget().getNumSamples() <= 1)
		throw tcu::NotSupportedError("No multisample buffers");

	m_initCalled = true;

	// Query and log number of samples per pixel.

	gl.getIntegerv(GL_SAMPLES, &m_numSamples);
	GLU_EXPECT_NO_ERROR(gl.getError(), "getIntegerv(GL_SAMPLES)");
	log << TestLog::Message << "GL_SAMPLES = " << m_numSamples << TestLog::EndMessage;

	// Prepare program.

	DE_ASSERT(!m_program);

	m_program = new glu::ShaderProgram(m_context.getRenderContext(), glu::ProgramSources()
		<< glu::VertexSource(tcu::StringTemplate(vertShaderSource).specialize(args))
		<< glu::FragmentSource(tcu::StringTemplate(fragShaderSource).specialize(args)));
	if (!m_program->isOk())
		throw tcu::TestError("Failed to compile program", DE_NULL, __FILE__, __LINE__);

	m_attrPositionLoc	= gl.getAttribLocation(m_program->getProgram(), "a_position");
	m_attrColorLoc		= gl.getAttribLocation(m_program->getProgram(), "a_color");
	GLU_EXPECT_NO_ERROR(gl.getError(), "getAttribLocation");

	if (m_attrPositionLoc < 0 || m_attrColorLoc < 0)
	{
		delete m_program;
		throw tcu::TestError("Invalid attribute locations", DE_NULL, __FILE__, __LINE__);
	}

	// Get suitable viewport size.

	m_viewportSize = de::min<int>(m_desiredViewportSize, de::min(m_context.getRenderTarget().getWidth(), m_context.getRenderTarget().getHeight()));
	randomizeViewport();
}